

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

int ProgramMain(int argc,char **argv)

{
  unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> uVar1;
  char *pcVar2;
  _Alloc_hider _Var3;
  Result RVar4;
  size_t sVar5;
  int iVar6;
  string_view spec_json_filename;
  allocator local_269;
  JSONParser parser_1;
  Script script;
  OptionParser parser;
  uint local_48;
  uint local_44;
  
  wabt::InitStdio();
  wabt::FileStream::CreateStdout();
  _Var3 = parser.program_name_._M_dataplus;
  uVar1 = s_stdout_stream;
  parser.program_name_._M_dataplus._M_p = (pointer)0x0;
  s_stdout_stream._M_t.
  super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
  super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)
       (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)
       _Var3._M_p;
  if ((__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)
      uVar1._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
      super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)0x0) {
    (**(code **)(*(long *)uVar1._M_t.
                          super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                          .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl + 8))();
    if (parser.program_name_._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)parser.program_name_._M_dataplus._M_p + 8))();
    }
  }
  wabt::OptionParser::OptionParser
            (&parser,"spectest-interp",
             "  read a Spectest JSON file, and run its tests in the interpreter.\n\nexamples:\n  # parse test.json and run the spec tests\n  $ spectest-interp test.json\n"
            );
  parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parser_1.json_offset_ =
       (size_t)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:70:72)>
               ::_M_invoke;
  parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:70:72)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'v',"verbose","Use multiple times for more info",(NullCallback *)&parser_1);
  if (parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage)(&parser_1,&parser_1,3);
  }
  wabt::Features::AddOptions(&s_features,&parser);
  parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parser_1.json_offset_ =
       (size_t)std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:77:20)>
               ::_M_invoke;
  parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:77:20)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'V',"value-stack-size","SIZE","Size in elements of the value stack",
             (Callback *)&parser_1);
  if (parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage)(&parser_1,&parser_1,3);
  }
  parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parser_1.json_offset_ =
       (size_t)std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:83:20)>
               ::_M_invoke;
  parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:83:20)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'C',"call-stack-size","SIZE","Size in elements of the call stack",
             (Callback *)&parser_1);
  if (parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage)(&parser_1,&parser_1,3);
  }
  parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parser_1.json_offset_ =
       (size_t)std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:88:20)>
               ::_M_invoke;
  parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:88:20)>
                ::_M_manager;
  wabt::OptionParser::AddOption(&parser,'t',"trace","Trace execution",(NullCallback *)&parser_1);
  if (parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage)(&parser_1,&parser_1,3);
  }
  std::__cxx11::string::string((string *)&parser_1,"filename",&local_269);
  script.filename._M_dataplus._M_p = (pointer)0x0;
  script.filename._M_string_length = 0;
  script.filename.field_2._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:91:22)>
       ::_M_invoke;
  script.filename.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:91:22)>
       ::_M_manager;
  wabt::OptionParser::AddArgument(&parser,(string *)&parser_1,One,(Callback *)&script);
  if (script.filename.field_2._M_allocated_capacity != 0) {
    (*(code *)script.filename.field_2._M_allocated_capacity)(&script,&script,3);
  }
  std::__cxx11::string::_M_dispose();
  wabt::OptionParser::Parse(&parser,argc,argv);
  wabt::OptionParser::~OptionParser(&parser);
  pcVar2 = s_infile;
  sVar5 = strlen(s_infile);
  parser_1.prev_loc_.field_1.field_0.line = 0;
  parser_1.prev_loc_.field_1._4_8_ = 0;
  parser_1.prev_loc_.filename.data_ = (char *)0x0;
  parser_1.prev_loc_.filename.size_._0_4_ = 0;
  parser_1.prev_loc_.filename.size_._4_4_ = 0;
  parser_1.has_prev_loc_ = false;
  parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parser_1.json_data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parser_1.json_offset_ = 0;
  parser_1.loc_.filename.data_ = (char *)0x0;
  parser_1.loc_.filename.size_._0_4_ = 0;
  parser_1.loc_.filename.size_._4_4_ = 0;
  parser_1.loc_.field_1.field_0.line = 0;
  parser_1.loc_.field_1._4_8_ = 0;
  spec_json_filename.size_ = sVar5;
  spec_json_filename.data_ = pcVar2;
  RVar4 = spectest::JSONParser::ReadFile(&parser_1,spec_json_filename);
  if (RVar4.enum_ == Error) {
    iVar6 = 1;
  }
  else {
    script.filename._M_dataplus._M_p = (pointer)&script.filename.field_2;
    script.filename._M_string_length = 0;
    script.filename.field_2._M_allocated_capacity =
         script.filename.field_2._M_allocated_capacity & 0xffffffffffffff00;
    script.commands.
    super__Vector_base<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    script.commands.
    super__Vector_base<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    script.commands.
    super__Vector_base<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RVar4 = spectest::JSONParser::ParseScript(&parser_1,&script);
    if (RVar4.enum_ == Error) {
      iVar6 = 1;
    }
    else {
      spectest::CommandRunner::CommandRunner((CommandRunner *)&parser);
      RVar4 = spectest::CommandRunner::Run((CommandRunner *)&parser,&script);
      if (RVar4.enum_ == Error) {
        iVar6 = 1;
      }
      else {
        printf("%d/%d tests passed.\n",(ulong)local_48,(ulong)local_44);
        iVar6 = local_44 - local_48;
      }
      spectest::CommandRunner::~CommandRunner((CommandRunner *)&parser);
    }
    spectest::Script::~Script(&script);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&parser_1);
  return iVar6;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();
  s_stdout_stream = FileStream::CreateStdout();

  ParseOptions(argc, argv);
  return spectest::ReadAndRunSpecJSON(s_infile);
}